

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O2

uint32_t trb_max_gap_to_type(trt_parent_cache ca,trt_printer_ctx *pc,trt_tree_ctx *tc)

{
  char *pcVar1;
  char *pcVar2;
  ly_bool lVar3;
  uint32_t uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long lVar9;
  uint32_t uVar10;
  trt_node *ptVar11;
  trt_node *ptVar12;
  byte bVar13;
  trt_node local_f0;
  trt_node local_90;
  size_t sVar8;
  
  bVar13 = 0;
  (*(pc->fp).modify.first_sibling)(&local_f0,ca,tc);
  uVar10 = 0;
  while( true ) {
    lVar3 = trp_node_is_empty(&local_f0);
    if (lVar3 != '\0') break;
    uVar4 = 0;
    if (local_f0.name.keys == '\0') {
      uVar4 = trb_gap_to_opts(&local_f0);
      pcVar1 = local_f0.name.add_opts;
      if (local_f0.name.add_opts == (char *)0x0) {
        iVar5 = 0;
      }
      else {
        sVar8 = strlen(local_f0.name.add_opts);
        iVar5 = (int)sVar8;
      }
      pcVar2 = local_f0.name.opts;
      if (local_f0.name.opts == (char *)0x0) {
        iVar6 = 0;
      }
      else {
        sVar8 = strlen(local_f0.name.opts);
        iVar6 = (int)sVar8;
      }
      uVar7 = iVar6 + iVar5;
      if (uVar7 < 4) {
        if (pcVar1 == (char *)0x0 && pcVar2 == (char *)0x0) {
          uVar7 = 0;
        }
        uVar4 = (uVar4 - uVar7) + 4;
      }
      else {
        uVar4 = uVar4 + 1;
      }
    }
    if ((int)uVar10 <= (int)uVar4) {
      uVar10 = uVar4;
    }
    (*(pc->fp).modify.next_sibling)(&local_90,ca,tc);
    ptVar11 = &local_90;
    ptVar12 = &local_f0;
    for (lVar9 = 0xc; lVar9 != 0; lVar9 = lVar9 + -1) {
      ptVar12->status = ptVar11->status;
      ptVar11 = (trt_node *)((long)ptVar11 + (ulong)bVar13 * -0x10 + 8);
      ptVar12 = (trt_node *)((long)ptVar12 + (ulong)bVar13 * -0x10 + 8);
    }
  }
  (*(pc->fp).modify.first_sibling)(&local_90,ca,tc);
  return uVar10;
}

Assistant:

static uint32_t
trb_max_gap_to_type(struct trt_parent_cache ca, struct trt_printer_ctx *pc, struct trt_tree_ctx *tc)
{
    struct trt_node node;
    int32_t maxlen, len;

    maxlen = 0;
    for (node = pc->fp.modify.first_sibling(ca, tc);
            !trp_node_is_empty(&node);
            node = pc->fp.modify.next_sibling(ca, tc)) {
        len = trb_gap_to_type(&node);
        maxlen = maxlen < len ? len : maxlen;
    }
    pc->fp.modify.first_sibling(ca, tc);

    return maxlen;
}